

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

void bench_field_is_square_var(void *arg,int iters)

{
  uint64_t *r;
  secp256k1_gej *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  secp256k1_fe *psVar12;
  uint64_t *puVar13;
  uint uVar14;
  ulong unaff_R12;
  secp256k1_fe sStack_b0;
  ulong uStack_88;
  ulong uStack_80;
  secp256k1_fe local_58;
  
  uVar9 = (ulong)(uint)iters;
  local_58.n[4] = *(uint64_t *)((long)arg + 0x60);
  local_58.n[0] = *(uint64_t *)((long)arg + 0x40);
  local_58.n[1] = *(uint64_t *)((long)arg + 0x48);
  local_58.n[2] = *(uint64_t *)((long)arg + 0x50);
  local_58.n[3] = *(uint64_t *)((long)arg + 0x58);
  if (iters < 1) {
    iVar10 = 0;
    psVar12 = (secp256k1_fe *)arg;
  }
  else {
    iVar10 = 0;
    unaff_R12 = (ulong)(uint)iters;
    do {
      iVar7 = secp256k1_fe_impl_is_square_var(&local_58);
      iVar10 = iVar10 + iVar7;
      local_58.n[0] = *(long *)((long)arg + 0x68) + local_58.n[0];
      local_58.n[1] = *(long *)((long)arg + 0x70) + local_58.n[1];
      local_58.n[2] = *(long *)((long)arg + 0x78) + local_58.n[2];
      local_58.n[3] = *(long *)((long)arg + 0x80) + local_58.n[3];
      local_58.n[4] = local_58.n[4] + *(long *)((long)arg + 0x88);
      psVar12 = &local_58;
      secp256k1_fe_impl_normalize_var(&local_58);
      uVar14 = (int)unaff_R12 - 1;
      unaff_R12 = (ulong)uVar14;
    } while (uVar14 != 0);
  }
  if (iVar10 <= iters) {
    return;
  }
  bench_field_is_square_var_cold_1();
  uStack_80 = unaff_R12;
  uStack_88 = (ulong)(uint)iters;
  iVar10 = (int)uVar9;
  uVar9 = uVar9 & 0xffffffff;
  if (iVar10 < 1) {
    iVar11 = 0;
    puVar13 = psVar12->n;
    iVar7 = iVar10;
  }
  else {
    r = psVar12[1].n + 3;
    iVar11 = 0;
    do {
      sStack_b0.n[4] = psVar12[2].n[2];
      sStack_b0.n[0] = *r;
      sStack_b0.n[1] = psVar12[1].n[4];
      sStack_b0.n[2] = psVar12[2].n[0];
      sStack_b0.n[3] = psVar12[2].n[1];
      puVar13 = r;
      iVar7 = (int)&sStack_b0;
      iVar8 = secp256k1_fe_sqrt((secp256k1_fe *)r,&sStack_b0);
      iVar11 = iVar11 + iVar8;
      uVar1 = psVar12[1].n[4];
      uVar2 = psVar12[2].n[0];
      uVar3 = psVar12[2].n[1];
      uVar4 = psVar12[2].n[4];
      uVar5 = psVar12[3].n[0];
      uVar6 = psVar12[3].n[1];
      psVar12[1].n[3] = psVar12[2].n[3] + psVar12[1].n[3];
      psVar12[1].n[4] = uVar4 + uVar1;
      psVar12[2].n[0] = uVar5 + uVar2;
      psVar12[2].n[1] = uVar6 + uVar3;
      psVar12[2].n[2] = psVar12[2].n[2] + psVar12[3].n[2];
      uVar14 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar14;
    } while (uVar14 != 0);
  }
  if (iVar10 < iVar11) {
    bench_field_sqrt_cold_1();
    if (0 < iVar7) {
      r_00 = (secp256k1_gej *)((long)puVar13 + 400);
      do {
        if ((int)((secp256k1_fe *)((long)puVar13 + 0x208))->n[0] == 0) {
          secp256k1_gej_double(r_00,r_00);
        }
        else {
          *(undefined4 *)((secp256k1_fe *)((long)puVar13 + 0x208))->n = 1;
          ((secp256k1_fe *)((long)puVar13 + 0x1e0))->n[2] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1e0))->n[3] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1e0))->n[0] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1e0))->n[1] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1b8))->n[3] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1b8))->n[4] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1b8))->n[1] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1b8))->n[2] = 0;
          ((secp256k1_fe *)((long)puVar13 + 400))->n[4] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1b8))->n[0] = 0;
          ((secp256k1_fe *)((long)puVar13 + 400))->n[2] = 0;
          ((secp256k1_fe *)((long)puVar13 + 400))->n[3] = 0;
          (r_00->x).n[0] = 0;
          ((secp256k1_fe *)((long)puVar13 + 400))->n[1] = 0;
          ((secp256k1_fe *)((long)puVar13 + 0x1e0))->n[4] = 0;
        }
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    return;
  }
  return;
}

Assistant:

static void bench_field_is_square_var(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_fe t = data->fe[0];

    for (i = 0; i < iters; i++) {
        j += secp256k1_fe_is_square_var(&t);
        secp256k1_fe_add(&t, &data->fe[1]);
        secp256k1_fe_normalize_var(&t);
    }
    CHECK(j <= iters);
}